

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

PathIntegrator *
phyr::createPathIntegrator
          (shared_ptr<phyr::Sampler> *sampler,shared_ptr<const_phyr::Camera> *camera,int maxDepth)

{
  int iVar1;
  Film *in_RDI;
  Bounds2i _pixelBounds;
  shared_ptr<const_phyr::Camera> *in_stack_ffffffffffffff18;
  Bounds2<int> *in_stack_ffffffffffffff20;
  allocator local_a1;
  string local_a0 [16];
  string *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Bounds2i *in_stack_ffffffffffffff80;
  shared_ptr<phyr::Sampler> *in_stack_ffffffffffffff88;
  shared_ptr<const_phyr::Camera> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  PathIntegrator *in_stack_ffffffffffffffa0;
  string local_50 [36];
  Bounds2i local_2c;
  PathIntegrator *local_8;
  
  std::__shared_ptr_access<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a912a);
  local_2c = Film::getSampleBounds(in_RDI);
  iVar1 = Bounds2<int>::area(in_stack_ffffffffffffff20);
  if (iVar1 == 0) {
    formatString<char_const*,int>
              ((char *)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c);
    std::operator<<((ostream *)&std::cerr,local_50);
    std::__cxx11::string::~string(local_50);
    local_8 = (PathIntegrator *)0x0;
  }
  else {
    local_8 = (PathIntegrator *)operator_new(0x70);
    std::shared_ptr<const_phyr::Camera>::shared_ptr
              ((shared_ptr<const_phyr::Camera> *)local_8,in_stack_ffffffffffffff18);
    std::shared_ptr<phyr::Sampler>::shared_ptr
              ((shared_ptr<phyr::Sampler> *)local_8,
               (shared_ptr<phyr::Sampler> *)in_stack_ffffffffffffff18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"spatial",&local_a1);
    PathIntegrator::PathIntegrator
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::shared_ptr<phyr::Sampler>::~shared_ptr((shared_ptr<phyr::Sampler> *)0x1a9297);
    std::shared_ptr<const_phyr::Camera>::~shared_ptr((shared_ptr<const_phyr::Camera> *)0x1a92a1);
  }
  return local_8;
}

Assistant:

PathIntegrator* createPathIntegrator(std::shared_ptr<Sampler> sampler,
                                     std::shared_ptr<const Camera> camera,
                                     int maxDepth) {
    Bounds2i _pixelBounds = camera->film->getSampleBounds();

    if (_pixelBounds.area() == 0) {
        LOG_ERR("Degenerate pixel bounds specified");
        return nullptr;
    }

    return new PathIntegrator(maxDepth, camera, sampler, _pixelBounds, 1, "spatial");
}